

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall mkvparser::Chapters::~Chapters(Chapters *this)

{
  Edition *pEVar1;
  uint uVar2;
  
  while( true ) {
    pEVar1 = this->m_editions;
    if (this->m_editions_count < 1) break;
    uVar2 = this->m_editions_count - 1;
    this->m_editions_count = uVar2;
    Edition::Clear(pEVar1 + uVar2);
  }
  if (pEVar1 != (Edition *)0x0) {
    operator_delete__(&pEVar1[-1].m_atoms_size);
    return;
  }
  return;
}

Assistant:

Chapters::~Chapters() {
  while (m_editions_count > 0) {
    Edition& e = m_editions[--m_editions_count];
    e.Clear();
  }
  delete[] m_editions;
}